

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

void __thiscall
tinyusdz::MetaVariable::set_value<std::array<tinyusdz::value::half,4ul>>
          (MetaVariable *this,array<tinyusdz::value::half,_4UL> *v)

{
  string local_38 [32];
  array<tinyusdz::value::half,_4UL> *local_18;
  array<tinyusdz::value::half,_4UL> *v_local;
  MetaVariable *this_local;
  
  local_18 = v;
  v_local = (array<tinyusdz::value::half,_4UL> *)this;
  tinyusdz::value::Value::operator=(&this->_value,v);
  ::std::__cxx11::string::string(local_38);
  ::std::__cxx11::string::operator=((string *)&this->_name,local_38);
  ::std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void set_value(const T &v) {
    // TODO: Check T is supported type for Metadatum.
    _value = v;

    _name = std::string();  // empty
  }